

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O3

int do_rsa_print(BIO *out,RSA *rsa,int off,int include_private)

{
  uint uVar1;
  int iVar2;
  char *name;
  char *name_00;
  
  uVar1 = 0;
  if ((BIGNUM *)rsa->n != (BIGNUM *)0x0) {
    uVar1 = BN_num_bits((BIGNUM *)rsa->n);
  }
  iVar2 = BIO_indent((BIO *)out,off,0x80);
  if (iVar2 != 0) {
    if ((include_private == 0) || (rsa->d == (BIGNUM *)0x0)) {
      iVar2 = BIO_printf((BIO *)out,"Public-Key: (%d bit)\n",(ulong)uVar1);
      if (iVar2 < 1) {
        return 0;
      }
      name = "Modulus:";
      name_00 = "Exponent:";
    }
    else {
      iVar2 = BIO_printf((BIO *)out,"Private-Key: (%d bit)\n",(ulong)uVar1);
      if (iVar2 < 1) {
        return 0;
      }
      name = "modulus:";
      name_00 = "publicExponent:";
    }
    iVar2 = bn_print(out,name,rsa->n,off);
    if ((iVar2 != 0) && (iVar2 = bn_print(out,name_00,rsa->e,off), iVar2 != 0)) {
      if (include_private != 0) {
        iVar2 = bn_print(out,"privateExponent:",rsa->d,off);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = bn_print(out,"prime1:",rsa->p,off);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = bn_print(out,"prime2:",rsa->q,off);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = bn_print(out,"exponent1:",rsa->dmp1,off);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = bn_print(out,"exponent2:",rsa->dmq1,off);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = bn_print(out,"coefficient:",rsa->iqmp,off);
        if (iVar2 == 0) {
          return 0;
        }
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

static int do_rsa_print(BIO *out, const RSA *rsa, int off,
                        int include_private) {
  int mod_len = 0;
  if (rsa->n != NULL) {
    mod_len = BN_num_bits(rsa->n);
  }

  if (!BIO_indent(out, off, 128)) {
    return 0;
  }

  const char *s, *str;
  if (include_private && rsa->d) {
    if (BIO_printf(out, "Private-Key: (%d bit)\n", mod_len) <= 0) {
      return 0;
    }
    str = "modulus:";
    s = "publicExponent:";
  } else {
    if (BIO_printf(out, "Public-Key: (%d bit)\n", mod_len) <= 0) {
      return 0;
    }
    str = "Modulus:";
    s = "Exponent:";
  }
  if (!bn_print(out, str, rsa->n, off) || !bn_print(out, s, rsa->e, off)) {
    return 0;
  }

  if (include_private) {
    if (!bn_print(out, "privateExponent:", rsa->d, off) ||
        !bn_print(out, "prime1:", rsa->p, off) ||
        !bn_print(out, "prime2:", rsa->q, off) ||
        !bn_print(out, "exponent1:", rsa->dmp1, off) ||
        !bn_print(out, "exponent2:", rsa->dmq1, off) ||
        !bn_print(out, "coefficient:", rsa->iqmp, off)) {
      return 0;
    }
  }

  return 1;
}